

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseFieldOptions
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  int iVar2;
  FieldOptions *this_00;
  FileDescriptorProto *containing_file_00;
  LocationRecorder location;
  LocationRecorder local_40;
  
  containing_file_00 = containing_file;
  iVar2 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  bVar1 = true;
  if (iVar2 == 0) {
    LocationRecorder::LocationRecorder(&local_40,field_location,8);
    bVar1 = Consume(this,"[");
    if (bVar1) {
      do {
        iVar2 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
        if (iVar2 == 0) {
          bVar1 = ParseDefaultAssignment(this,field,field_location,containing_file_00);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
          if (iVar2 == 0) {
            bVar1 = ParseJsonName(this,field,field_location,containing_file_00);
          }
          else {
            *(byte *)(field->_has_bits_).has_bits_ = (byte)(field->_has_bits_).has_bits_[0] | 0x20;
            if (field->options_ == (FieldOptions *)0x0) {
              this_00 = (FieldOptions *)operator_new(0x78);
              FieldOptions::FieldOptions(this_00);
              field->options_ = this_00;
            }
            containing_file_00 = containing_file;
            bVar1 = ParseOption(this,&field->options_->super_Message,&local_40,containing_file,
                                OPTION_ASSIGNMENT);
          }
        }
        if (bVar1 == false) goto LAB_002d173e;
        bVar1 = TryConsume(this,",");
      } while (bVar1);
      bVar1 = Consume(this,"]");
    }
    else {
LAB_002d173e:
      bVar1 = false;
    }
    LocationRecorder::~LocationRecorder(&local_40);
  }
  return bVar1;
}

Assistant:

bool Parser::ParseFieldOptions(FieldDescriptorProto* field,
                               const LocationRecorder& field_location,
                               const FileDescriptorProto* containing_file) {
  if (!LookingAt("[")) return true;

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kOptionsFieldNumber);

  DO(Consume("["));

  // Parse field options.
  do {
    if (LookingAt("default")) {
      // We intentionally pass field_location rather than location here, since
      // the default value is not actually an option.
      DO(ParseDefaultAssignment(field, field_location, containing_file));
    } else if (LookingAt("json_name")) {
      // Like default value, this "json_name" is not an actual option.
      DO(ParseJsonName(field, field_location, containing_file));
    } else {
      DO(ParseOption(field->mutable_options(), location,
                     containing_file, OPTION_ASSIGNMENT));
    }
  } while (TryConsume(","));

  DO(Consume("]"));
  return true;
}